

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

float ggml_get_f32_1d(ggml_tensor *tensor,int i)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  switch(tensor->type) {
  case GGML_TYPE_Q4_0:
    pcVar3 = "false";
    uVar2 = 0xb60;
    break;
  case GGML_TYPE_Q4_1:
    pcVar3 = "false";
    uVar2 = 0xb64;
    break;
  case GGML_TYPE_I8:
    if (tensor->nb[0] == 1) {
      iVar1 = (int)*(char *)((long)tensor->data + (long)i);
LAB_0011c966:
      return (float)iVar1;
    }
    pcVar3 = "tensor->nb[0] == sizeof(int8_t)";
    uVar2 = 0xb68;
    break;
  case GGML_TYPE_I16:
    if (tensor->nb[0] == 2) {
      iVar1 = (int)*(short *)((long)tensor->data + (long)i * 2);
      goto LAB_0011c966;
    }
    pcVar3 = "tensor->nb[0] == sizeof(int16_t)";
    uVar2 = 0xb6d;
    break;
  case GGML_TYPE_I32:
    if (tensor->nb[0] == 4) {
      return (float)*(int *)((long)tensor->data + (long)i * 4);
    }
    pcVar3 = "tensor->nb[0] == sizeof(int32_t)";
    uVar2 = 0xb72;
    break;
  case GGML_TYPE_F16:
    if (tensor->nb[0] == 2) {
      return table_f32_f16[*(ushort *)((long)tensor->data + (long)i * 2)];
    }
    pcVar3 = "tensor->nb[0] == sizeof(ggml_fp16_t)";
    uVar2 = 0xb77;
    break;
  case GGML_TYPE_F32:
    if (tensor->nb[0] == 4) {
      return *(float *)((long)tensor->data + (long)i * 4);
    }
    pcVar3 = "tensor->nb[0] == sizeof(float)";
    uVar2 = 0xb7c;
    break;
  case GGML_TYPE_COUNT:
    pcVar3 = "false";
    uVar2 = 0xb81;
    break;
  default:
    return 0.0;
  }
  fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",uVar2,
          pcVar3);
  abort();
}

Assistant:

float ggml_get_f32_1d(const struct ggml_tensor * tensor, int i) {
    switch (tensor->type) {
        case GGML_TYPE_Q4_0:
            {
                GGML_ASSERT(false);
            } break;
        case GGML_TYPE_Q4_1:
            {
                GGML_ASSERT(false);
            } break;
        case GGML_TYPE_I8:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int8_t));
                return ((int8_t *)(tensor->data))[i];
            } break;
        case GGML_TYPE_I16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int16_t));
                return ((int16_t *)(tensor->data))[i];
            } break;
        case GGML_TYPE_I32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int32_t));
                return ((int32_t *)(tensor->data))[i];
            } break;
        case GGML_TYPE_F16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(ggml_fp16_t));
                return GGML_FP16_TO_FP32(((ggml_fp16_t *)(tensor->data))[i]);
            } break;
        case GGML_TYPE_F32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(float));
                return ((float *)(tensor->data))[i];
            } break;
        case GGML_TYPE_COUNT:
            {
                GGML_ASSERT(false);
            } break;
    }

    return 0.0f;
}